

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<std::__cxx11::string_const&>>,std::tuple<ot::commissioner::JoinerType,std::__cxx11::string_const&,std::__cxx11::string_const&>>
               (tuple<testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
                *matcher_tuple,
               tuple<ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *value_tuple)

{
  element_type *peVar1;
  element_type *peVar2;
  undefined1 uVar3;
  int iVar4;
  
  peVar1 = (matcher_tuple->
           super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
           ).super__Head_base<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_false>.
           _M_head_impl.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  iVar4 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (peVar1,&(value_tuple->
                             super__Tuple_impl<0UL,_ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                             ).super__Head_base<0UL,_ot::commissioner::JoinerType,_false>);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    peVar2 = (matcher_tuple->
             super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>
             .
             super__Head_base<1UL,_testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_false>
             ._M_head_impl.
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    iVar4 = (*(peVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (peVar2,(value_tuple->
                              super__Tuple_impl<0UL,_ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ).
                              super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              .
                              super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                              ._M_head_impl);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }